

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O3

void __thiscall
diy::detail::ReductionFunctor<Block,_diy::detail::KDTreePartners>::operator()
          (ReductionFunctor<Block,_diy::detail::KDTreePartners> *this,Block *b,ProxyWithLink *cp)

{
  KDTreePartners *this_00;
  int gid;
  pointer ppVar1;
  Master *m;
  bool bVar2;
  const_iterator __begin4;
  pointer pBVar3;
  int round;
  const_iterator __end4;
  BlockID target;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  ReduceProxy rp;
  BlockID local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_128;
  ReduceProxy local_108;
  
  this_00 = &this->partners;
  bVar2 = KDTreePartners::active
                    (this_00,this->round,(cp->super_Proxy).gid_,(cp->super_Proxy).master_);
  if (bVar2) {
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    round = this->round;
    if (0 < round) {
      KDTreePartners::incoming
                (this_00,round,(cp->super_Proxy).gid_,&local_128,(cp->super_Proxy).master_);
      round = this->round;
    }
    ppVar1 = (this->partners).rounds_.
             super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (round < (int)((ulong)((long)(this->partners).rounds_.
                                    super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3)
       ) {
      gid = (cp->super_Proxy).gid_;
      m = (cp->super_Proxy).master_;
      if (ppVar1[round].first == true) {
        if (ppVar1[round].second < 0) {
          KDTreePartners::link_neighbors(this_00,-1,gid,&local_148,m);
        }
        else {
          RegularPartners::fill
                    (&(this->partners).swap.super_RegularPartners,ppVar1[round].second,gid,
                     &local_148);
        }
      }
      else {
        RegularAllReducePartners::outgoing
                  (&(this->partners).histogram,ppVar1[round].second,gid,&local_148,m);
      }
    }
    ReduceProxy::ReduceProxy
              (&local_108,&cp->super_Proxy,b,this->round,this->assigner,&local_128,&local_148);
    local_150 = (BlockID)b;
    if ((this->reduce).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->reduce)._M_invoker)((_Any_data *)&this->reduce,(Block **)&local_150,&local_108,this_00)
    ;
    if (local_108.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (ulong)(long)(int)((ulong)((long)local_108.out_link_.neighbors_.
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.out_link_.neighbors_.
                                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) &&
        (long)local_108.out_link_.neighbors_.
              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_108.out_link_.neighbors_.
              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      pBVar3 = local_108.out_link_.neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_150 = *pBVar3;
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[](&local_108.super_Proxy.outgoing_,&local_150);
        pBVar3 = pBVar3 + 1;
      } while (pBVar3 != local_108.out_link_.neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_108.out_link_.super_Factory<diy::Link>._vptr_Factory =
         (_func_int **)&PTR_id_abi_cxx11__001586f8;
    if (local_108.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.out_link_.neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_108.in_link_.super_Factory<diy::Link>._vptr_Factory =
         (_func_int **)&PTR_id_abi_cxx11__001586f8;
    if (local_108.in_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.in_link_.neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.in_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.in_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Master::Proxy::~Proxy(&local_108.super_Proxy);
    if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }